

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

point_t * opengv::triangulation::triangulate
                    (point_t *__return_storage_ptr__,RelativeAdapterBase *adapter,size_t index)

{
  double *pdVar1;
  non_const_type pMVar2;
  size_t sVar3;
  long lVar4;
  MatrixXd A;
  bearingVector_t f2;
  bearingVector_t f1;
  translation_t t12;
  Matrix<double,_3,_4,_0,_3,_4> P2;
  Matrix<double,_3,_4,_0,_3,_4> P1;
  rotation_t R12;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> mySVD;
  MatrixType local_470;
  non_const_type local_458;
  size_t local_450;
  double local_448;
  double local_440;
  double local_438;
  undefined1 local_430 [48];
  Index local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  Matrix<double,_3,_1,_0,_3,_1> local_3e0;
  Matrix<double,_3,_4,_0,_3,_4> local_3c0;
  Matrix<double,_3,_4,_0,_3,_4> local_360;
  Matrix<double,_3,_3,_0,_3,_3> local_300;
  undefined1 local_298 [72];
  Index local_250;
  scalar_constant_op<double> local_230;
  double *local_228;
  Matrix<double,_3,_4,_0,_3,_4> *local_218;
  undefined1 local_210 [16];
  Index local_200;
  
  local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[2];
  local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[0];
  local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[1];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[8];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[0];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[1];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[2];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[3];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[4];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[5];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[6];
  local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
       .array[7];
  local_298._8_8_ = 0;
  local_458 = (non_const_type)__return_storage_ptr__;
  local_450 = index;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,4,0,3,4>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>> *)&local_360,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
              *)local_298);
  local_298._8_8_ = 0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
       1.0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
       0.0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
       0.0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
       0.0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4] =
       1.0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8] =
       1.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,4,0,3,4>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>> *)&local_3c0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
              *)local_298);
  local_298._24_8_ = 0.0;
  local_298._32_8_ = 0;
  local_298._40_8_ = 3;
  local_430._0_8_ = &local_300;
  local_298._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>> *)&local_3c0;
  local_298._16_8_ = (PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>> *)&local_3c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)local_298,
             (Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_430);
  local_298._0_8_ =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       + 9;
  local_430._0_8_ = &local_300;
  local_430._16_8_ = &local_3e0;
  local_298._24_8_ = 0.0;
  local_298._32_8_ = 3;
  local_298._40_8_ = 3;
  local_298._16_8_ = (PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>> *)&local_3c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false> *)local_298,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
              *)local_430);
  sVar3 = local_450;
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_3f8,adapter,local_450);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_448,adapter,sVar3);
  local_298._0_4_ = 4;
  local_430._0_4_ = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_470,(int *)local_298,(int *)local_430);
  local_298._32_8_ =
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       + 2;
  local_298._24_8_ = local_3f8;
  local_298._56_8_ = 2;
  local_298._64_8_ = 0;
  local_430._32_16_ = ZEXT816(0) << 0x20;
  local_250 = 1;
  local_230.m_other = local_3e8;
  local_200 = 1;
  local_430._0_8_ =
       local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  local_430._16_8_ =
       local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_400 = 1;
  local_430._24_8_ = (Matrix<double,_1,_1,0,_1,_1> *)&local_470;
  local_298._48_8_ = &local_360;
  local_228 = (double *)&local_360;
  local_218 = &local_360;
  local_210 = local_430._32_16_;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_430,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>
              *)local_298);
  local_298._32_8_ =
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       + 2;
  local_228 = local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
              m_data.array + 1;
  local_430._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
        local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
       ->m_storage).m_data.array + 1;
  local_298._24_8_ = local_3f0;
  local_298._56_8_ = 2;
  local_298._64_8_ = 0;
  local_250 = 1;
  local_230.m_other = local_3e8;
  local_210 = ZEXT816(1);
  local_200 = 1;
  local_430._16_8_ =
       local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_430._32_16_ = ZEXT816(1);
  local_400 = 1;
  local_430._24_8_ = (Matrix<double,_1,_1,0,_1,_1> *)&local_470;
  local_298._48_8_ = &local_360;
  local_218 = &local_360;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_430,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>
              *)local_298);
  pdVar1 = local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array + 2;
  local_298._24_8_ = local_448;
  local_298._56_8_ = 2;
  local_298._64_8_ = 0;
  local_210 = ZEXT816(0) << 0x20;
  local_250 = 1;
  local_230.m_other = local_438;
  local_200 = 1;
  local_430._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
        local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
       ->m_storage).m_data.array + 2;
  local_430._16_8_ =
       local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_430._32_16_ = ZEXT816(2);
  local_400 = 1;
  local_430._24_8_ = (Matrix<double,_1,_1,0,_1,_1> *)&local_470;
  local_298._32_8_ = pdVar1;
  local_298._48_8_ = &local_3c0;
  local_228 = (double *)&local_3c0;
  local_218 = &local_3c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_430,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>
              *)local_298);
  local_228 = local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
              m_data.array + 1;
  local_430._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
        local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
       ->m_storage).m_data.array + 3;
  local_430._16_8_ =
       local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_430._32_16_ = ZEXT816(3);
  local_400 = 1;
  local_298._24_8_ = local_440;
  local_298._56_8_ = 2;
  local_298._64_8_ = 0;
  local_250 = 1;
  local_230.m_other = local_438;
  local_210 = ZEXT816(1);
  local_200 = 1;
  local_430._24_8_ = (Matrix<double,_1,_1,0,_1,_1> *)&local_470;
  local_298._32_8_ = pdVar1;
  local_298._48_8_ = &local_3c0;
  local_218 = &local_3c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_430,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>
              *)local_298);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_298,&local_470,0x10);
  pMVar2 = local_458;
  lVar4 = local_298._32_8_ * 0x18;
  (local_458->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [0] = *(double *)(local_298._24_8_ + lVar4);
  (local_458->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [1] = *(double *)(local_298._24_8_ + 8 + lVar4);
  (local_458->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [2] = *(double *)(local_298._24_8_ + 0x10 + lVar4);
  local_430._16_8_ = *(undefined8 *)(local_298._24_8_ + 0x18 + lVar4);
  local_430._0_8_ = local_458;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_458,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_430);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_298);
  Eigen::internal::handmade_aligned_free
            (local_470.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  return (point_t *)pMVar2;
}

Assistant:

opengv::point_t
opengv::triangulation::triangulate(
    const relative_pose::RelativeAdapterBase & adapter,
    size_t index )
{
  translation_t t12 = adapter.gett12();
  rotation_t R12 = adapter.getR12();
  Eigen::Matrix<double,3,4> P1 = Eigen::Matrix<double,3,4>::Zero();
  P1.block<3,3>(0,0) = Eigen::Matrix3d::Identity();
  Eigen::Matrix<double,3,4> P2 = Eigen::Matrix<double,3,4>::Zero();
  P2.block<3,3>(0,0) = R12.transpose();
  P2.block<3,1>(0,3) = -R12.transpose()*t12;
  bearingVector_t f1 = adapter.getBearingVector1(index);
  bearingVector_t f2 = adapter.getBearingVector2(index);

  Eigen::MatrixXd A(4,4);
  A.row(0) = f1[0] * P1.row(2) - f1[2] * P1.row(0);
  A.row(1) = f1[1] * P1.row(2) - f1[2] * P1.row(1);
  A.row(2) = f2[0] * P2.row(2) - f2[2] * P2.row(0);
  A.row(3) = f2[1] * P2.row(2) - f2[2] * P2.row(1);

  Eigen::JacobiSVD< Eigen::MatrixXd > mySVD(A, Eigen::ComputeFullV );
  point_t worldPoint;
  worldPoint[0] = mySVD.matrixV()(0,3);
  worldPoint[1] = mySVD.matrixV()(1,3);
  worldPoint[2] = mySVD.matrixV()(2,3);
  worldPoint = worldPoint / mySVD.matrixV()(3,3);

  return worldPoint;
}